

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O1

void brotli::RefineEntropyCodes<brotli::Histogram<520>,unsigned_short>
               (unsigned_short *data,size_t length,size_t stride,
               vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *vec)

{
  pointer pHVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  bool bVar10;
  Histogram<520> sample;
  int local_860 [520];
  long local_40;
  undefined8 local_38;
  
  pHVar1 = (vec->
           super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(vec->
                 super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1) / 0x830;
  uVar7 = (length * 2) / stride + uVar2 + 99;
  if (uVar7 != uVar7 % uVar2) {
    sVar8 = length;
    if (stride < length) {
      sVar8 = stride;
    }
    uVar9 = 7;
    uVar6 = 0;
    do {
      memset(local_860,0,0x828);
      local_38 = 0x7ff0000000000000;
      if (stride < length) {
        bVar10 = uVar9 == 0;
        uVar9 = uVar9 * 0x41a7;
        if (bVar10) {
          uVar9 = 1;
        }
        uVar4 = (ulong)uVar9 % (1 - (stride - length));
        sVar5 = stride;
      }
      else {
        uVar4 = 0;
        sVar5 = length;
      }
      lVar3 = local_40 + sVar5;
      local_40 = lVar3;
      if (sVar5 != 0) {
        sVar5 = 0;
        do {
          local_860[data[uVar4 + sVar5]] = local_860[data[uVar4 + sVar5]] + 1;
          sVar5 = sVar5 + 1;
        } while (sVar8 != sVar5);
      }
      pHVar1[uVar6 % uVar2].total_count_ = pHVar1[uVar6 % uVar2].total_count_ + lVar3;
      lVar3 = 0;
      do {
        pHVar1[uVar6 % uVar2].data_[lVar3] = pHVar1[uVar6 % uVar2].data_[lVar3] + local_860[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x208);
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar7 - uVar7 % uVar2);
  }
  return;
}

Assistant:

void RefineEntropyCodes(const DataType* data, size_t length,
                        size_t stride,
                        std::vector<HistogramType>* vec) {
  size_t iters =
      kIterMulForRefining * length / stride + kMinItersForRefining;
  unsigned int seed = 7;
  iters = ((iters + vec->size() - 1) / vec->size()) * vec->size();
  for (size_t iter = 0; iter < iters; ++iter) {
    HistogramType sample;
    RandomSample(&seed, data, length, stride, &sample);
    size_t ix = iter % vec->size();
    (*vec)[ix].AddHistogram(sample);
  }
}